

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto3_arena_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::Proto3ArenaTest_UnknownFields_Test::TestBody
          (Proto3ArenaTest_UnknownFields_Test *this)

{
  int iVar1;
  TestAllTypes *m;
  UnknownFieldSet *this_00;
  SooRep *this_01;
  pointer *__ptr;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_02;
  pointer message;
  char *in_R9;
  Metadata MVar2;
  string_view data;
  Arena arena;
  TestAllTypes original;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_438;
  Message local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_428;
  undefined1 local_420 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_418;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_410;
  AssertHelper local_400;
  ThreadSafeArena local_3f8;
  TestAllTypes local_350;
  
  proto3_arena_unittest::TestAllTypes::TestAllTypes(&local_350,(Arena *)0x0);
  SetAllFields(&local_350);
  protobuf::internal::ThreadSafeArena::ThreadSafeArena(&local_3f8);
  m = (TestAllTypes *)
      Arena::DefaultConstruct<proto3_arena_unittest::TestAllTypes>((Arena *)&local_3f8);
  MessageLite::SerializeAsString_abi_cxx11_((string *)local_420,(MessageLite *)&local_350);
  data._M_str._1_7_ = local_420._1_7_;
  data._M_str._0_1_ = local_420[0];
  data._M_len = (size_t)local_418;
  MessageLite::ParseFromString((MessageLite *)m,data);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_420._1_7_,local_420[0]) != &local_410) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_420._1_7_,local_420[0]),local_410._M_allocated_capacity + 1);
  }
  ExpectAllFieldsSet(m);
  MVar2 = proto3_arena_unittest::TestAllTypes::GetMetadata
                    ((TestAllTypes *)proto3_arena_unittest::_TestAllTypes_default_instance_);
  this_00 = Reflection::MutableUnknownFields(MVar2.reflection,(Message *)m);
  UnknownFieldSet::AddVarint(this_00,1,2);
  local_430.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )proto3_arena_unittest::TestAllTypes::ByteSizeLong(&local_350);
  local_438._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       proto3_arena_unittest::TestAllTypes::ByteSizeLong(m);
  testing::internal::CmpHelperNE<unsigned_long,unsigned_long>
            ((internal *)local_420,"original.ByteSizeLong()","arena_message->ByteSizeLong()",
             (unsigned_long *)&local_430,(unsigned_long *)&local_438);
  if (local_420[0] == (internal)0x0) {
    testing::Message::Message(&local_430);
    if (local_418 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = anon_var_dwarf_a22956 + 5;
    }
    else {
      message = (local_418->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_438,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/proto3_arena_unittest.cc"
               ,0x7f,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_438,&local_430);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_438);
    if (local_430.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_430.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
    if (local_418 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_008d2a0e;
    this_02 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_418;
  }
  else {
    if (local_418 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_418,local_418);
    }
    MVar2 = proto3_arena_unittest::TestAllTypes::GetMetadata
                      ((TestAllTypes *)proto3_arena_unittest::_TestAllTypes_default_instance_);
    this_01 = (SooRep *)Reflection::GetUnknownFields(MVar2.reflection,(Message *)m);
    iVar1 = protobuf::internal::SooRep::size
                      (this_01,(undefined1  [16])
                               ((undefined1  [16])this_01->field_0 & (undefined1  [16])0x4) ==
                               (undefined1  [16])0x0);
    local_430.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_1_ = iVar1 != 0;
    local_428 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 != 0) goto LAB_008d2a0e;
    testing::Message::Message((Message *)&local_438);
    this_02 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_428;
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_420,(internal *)&local_430,
               (AssertionResult *)
               "arena_message->GetReflection()->GetUnknownFields(*arena_message).empty()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_400,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/proto3_arena_unittest.cc"
               ,0x81,(char *)CONCAT71(local_420._1_7_,local_420[0]));
    testing::internal::AssertHelper::operator=(&local_400,(Message *)&local_438);
    testing::internal::AssertHelper::~AssertHelper(&local_400);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_420._1_7_,local_420[0]) != &local_410) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_420._1_7_,local_420[0]),local_410._M_allocated_capacity + 1)
      ;
    }
    if (local_438._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_438._M_head_impl + 8))();
    }
    local_418 = local_428;
    if (local_428 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_008d2a0e;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_02,local_418);
LAB_008d2a0e:
  protobuf::internal::ThreadSafeArena::~ThreadSafeArena(&local_3f8);
  proto3_arena_unittest::TestAllTypes::~TestAllTypes(&local_350);
  return;
}

Assistant:

TEST(Proto3ArenaTest, UnknownFields) {
  TestAllTypes original;
  SetAllFields(&original);

  Arena arena;
  TestAllTypes* arena_message = Arena::Create<TestAllTypes>(&arena);
  arena_message->ParseFromString(original.SerializeAsString());
  ExpectAllFieldsSet(*arena_message);

  // In proto3 we can still get a pointer to the UnknownFieldSet through
  // reflection API.
  UnknownFieldSet* unknown_fields =
      arena_message->GetReflection()->MutableUnknownFields(arena_message);
  // We can modify this UnknownFieldSet.
  unknown_fields->AddVarint(1, 2);
  // And the unknown fields should be changed.
  ASSERT_NE(original.ByteSizeLong(), arena_message->ByteSizeLong());
  ASSERT_FALSE(
      arena_message->GetReflection()->GetUnknownFields(*arena_message).empty());
}